

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

Gia_Man_t * Gia_ManDeriveDup(Gia_Man_t *p,int nPisNew)

{
  Gia_Man_t *p_00;
  Gia_Man_t *pNew;
  int i;
  int nPisNew_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManDup(p);
  for (pNew._0_4_ = 0; (int)pNew < nPisNew; pNew._0_4_ = (int)pNew + 1) {
    Gia_ManAppendCi(p_00);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDeriveDup( Gia_Man_t * p, int nPisNew )
{
    int i;
    Gia_Man_t * pNew = Gia_ManDup(p);
    for ( i = 0; i < nPisNew; i++ )
        Gia_ManAppendCi( pNew );
    return pNew;
}